

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O0

void penguinV::ProjectionProfile
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,bool horizontal,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *projection)

{
  byte bVar1;
  bool bVar2;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar3;
  reference puVar4;
  uint32_t in_ECX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint32_t in_R8D;
  byte in_R9B;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000008;
  ImageManager manager;
  ProjectionProfileForm4 funcTemp;
  const_iterator type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *types;
  uint8_t imageType;
  ProjectionProfileForm4 func;
  ImageTypeManager *registrator;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffee8;
  uint8_t requiredType;
  ImageManager *in_stack_fffffffffffffef0;
  FunctionTableHolder *in_stack_ffffffffffffff00;
  ImageManager *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  uint8_t in_stack_ffffffffffffff2f;
  ImageTypeManager *in_stack_ffffffffffffff30;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  undefined1 local_58 [24];
  undefined1 *local_40;
  uint8_t local_31;
  ProjectionProfileForm4 local_30;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_R9B & 1;
  this = ImageTypeManager::instance();
  PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  pFVar3 = ImageTypeManager::functionTable(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
  local_30 = pFVar3->ProjectionProfile;
  local_31 = PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  if ((local_30 == (ProjectionProfileForm4)0x0) &&
     (bVar2 = ImageTypeManager::isIntertypeConversionEnabled(this), bVar2)) {
    ImageTypeManager::imageTypes
              ((ImageTypeManager *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    local_40 = local_58;
    local_60._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                            (in_stack_fffffffffffffee8);
    while( true ) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend(in_stack_fffffffffffffee8);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_fffffffffffffef0,
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_fffffffffffffee8);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator*(&local_60);
      in_stack_ffffffffffffff00 =
           ImageTypeManager::functionTable(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
      if (in_stack_ffffffffffffff00->ProjectionProfile != (ProjectionProfileForm4)0x0) {
        local_30 = in_stack_ffffffffffffff00->ProjectionProfile;
        puVar4 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&local_60);
        local_31 = *puVar4;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&local_60);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff00);
  }
  requiredType = (uint8_t)((ulong)in_stack_fffffffffffffee8 >> 0x38);
  (anonymous_namespace)::
  verifyFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,bool,std::vector<unsigned_int,std::allocator<unsigned_int>>&)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_bool_vector<unsigned_int,_std::allocator<unsigned_int>_>_ptr
              *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),(char *)this);
  anon_unknown.dwarf_9a3be::ImageManager::ImageManager(in_stack_fffffffffffffef0,requiredType);
  (*local_30)(in_RDI,in_ESI,in_EDX,in_ECX,in_R8D,(bool)(bVar1 & 1),in_stack_00000008);
  anon_unknown.dwarf_9a3be::ImageManager::~ImageManager(in_stack_ffffffffffffff20);
  return;
}

Assistant:

void ProjectionProfile( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, bool horizontal,
                            std::vector < uint32_t > & projection )
    {
        initialize( image, ProjectionProfile )
        func( image, x, y, width, height, horizontal, projection );
    }